

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O1

int uv_spawn(uv_loop_t *loop,uv_process_t *process,uv_process_options_t *options)

{
  void **ppvVar1;
  uint *puVar2;
  uv_stdio_container_t *puVar3;
  long lVar4;
  uv_loop_t *puVar5;
  uint uVar6;
  int iVar7;
  int (*pipes) [2];
  long *plVar8;
  ssize_t sVar9;
  int *piVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  int (*fds) [2];
  uv_rwlock_t *rwlock;
  ulong uVar14;
  long lVar15;
  int signal_pipe [2];
  int status;
  int exec_errorno;
  int pipes_storage [8] [2];
  undefined8 local_b0;
  uint local_a4;
  int local_a0;
  uint local_9c;
  uv_process_t *local_98;
  uv_loop_t *local_90;
  void **local_88;
  ulong local_80;
  int local_78 [18];
  
  local_b0 = 0xffffffffffffffff;
  if (options->file == (char *)0x0) {
    __assert_fail("options->file != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/process.c"
                  ,0x16b,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  if (0x7f < options->flags) {
    __assert_fail("!(options->flags & ~(UV_PROCESS_DETACHED | UV_PROCESS_SETGID | UV_PROCESS_SETUID | UV_PROCESS_WINDOWS_HIDE | UV_PROCESS_WINDOWS_HIDE_CONSOLE | UV_PROCESS_WINDOWS_HIDE_GUI | UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/process.c"
                  ,0x172,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  process->loop = loop;
  process->type = UV_PROCESS;
  process->flags = 8;
  process->handle_queue[0] = loop->handle_queue;
  plVar8 = (long *)loop->handle_queue[1];
  process->handle_queue[1] = plVar8;
  *plVar8 = (long)process->handle_queue;
  loop->handle_queue[1] = process->handle_queue;
  process->next_closing = (uv_handle_t *)0x0;
  ppvVar1 = process->queue;
  process->queue[0] = ppvVar1;
  process->queue[1] = ppvVar1;
  uVar12 = options->stdio_count;
  local_a4 = 3;
  if (3 < (int)uVar12) {
    local_a4 = uVar12;
  }
  uVar13 = (ulong)local_a4;
  if ((int)uVar12 < 9) {
    pipes = (int (*) [2])local_78;
  }
  else {
    pipes = (int (*) [2])uv__malloc(uVar13 * 8);
  }
  local_80 = uVar13;
  if (pipes == (int (*) [2])0x0) {
    uVar12 = 0xfffffff4;
  }
  else {
    local_98 = process;
    local_90 = loop;
    local_88 = ppvVar1;
    memset(pipes,0xff,uVar13 * 8);
    if (0 < options->stdio_count) {
      lVar11 = 8;
      lVar15 = 0;
      fds = pipes;
      do {
        puVar3 = options->stdio;
        uVar6 = *(uint *)((long)puVar3 + lVar11 + -8);
        uVar12 = uVar6 & 7;
        switch(uVar12) {
        case 0:
          break;
        case 1:
          lVar4 = *(long *)((long)&puVar3->flags + lVar11);
          if (lVar4 == 0) {
            __assert_fail("container->data.stream != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/process.c"
                          ,0x85,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
          }
          uVar12 = 0xffffffea;
          if (*(int *)(lVar4 + 0x10) == 7) {
            uVar12 = uv_socketpair(1,0,*fds,0,0);
          }
          break;
        case 2:
        case 4:
          plVar8 = (long *)((long)&puVar3->flags + lVar11);
          if ((uVar6 & 2) == 0) {
            plVar8 = (long *)(*plVar8 + 0xb8);
          }
          if ((int)*plVar8 == -1) {
            uVar12 = 0xffffffea;
          }
          else {
            (*fds)[1] = (int)*plVar8;
            uVar12 = 0;
          }
          break;
        default:
          __assert_fail("0 && \"Unexpected flags\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/process.c"
                        ,0x99,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
        }
        if (uVar12 != 0) goto LAB_0019428a;
        lVar15 = lVar15 + 1;
        fds = fds + 1;
        lVar11 = lVar11 + 0x10;
      } while (lVar15 < options->stdio_count);
    }
    uVar12 = uv__make_pipe((int *)&local_b0,0);
    puVar5 = local_90;
    if (uVar12 == 0) {
      uv_signal_start(&local_90->child_watcher,uv__chld,0x11);
      rwlock = &puVar5->cloexec_lock;
      uv_rwlock_wrlock(rwlock);
      uVar12 = fork();
      if (uVar12 != 0xffffffff) {
        if (uVar12 == 0) {
          uv__process_child_init(options,local_a4,pipes,local_b0._4_4_);
LAB_00194531:
          __assert_fail("err == pid",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/process.c"
                        ,0x1ce,
                        "int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
        }
        uv_rwlock_wrunlock(rwlock);
        uv__close(local_b0._4_4_);
        local_98->status = 0;
        local_9c = 0;
        do {
          sVar9 = read((int)local_b0,&local_9c,4);
          if (sVar9 != -1) break;
          piVar10 = __errno_location();
        } while (*piVar10 == 4);
        if (sVar9 != 0) {
          if (sVar9 == 4) {
            do {
              uVar6 = waitpid(uVar12,&local_a0,0);
              if (uVar6 != 0xffffffff) break;
              piVar10 = __errno_location();
            } while (*piVar10 == 4);
            if (uVar6 != uVar12) {
              __assert_fail("err == pid",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/process.c"
                            ,0x1c9,
                            "int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)"
                           );
            }
          }
          else {
            if ((sVar9 != -1) || (piVar10 = __errno_location(), *piVar10 != 0x20)) {
LAB_00194519:
              abort();
            }
            do {
              uVar6 = waitpid(uVar12,&local_a0,0);
              if (uVar6 != 0xffffffff) break;
            } while (*piVar10 == 4);
            if (uVar6 != uVar12) goto LAB_00194531;
          }
        }
        local_a4 = uVar12;
        uv__close_nocheckstdio((int)local_b0);
        if (0 < options->stdio_count) {
          lVar11 = 0;
          lVar15 = 0;
          do {
            puVar3 = options->stdio;
            uVar12 = 0;
            if (((*(byte *)((long)&puVar3->flags + lVar11) & 1) != 0) &&
               (uVar12 = 0, -1 < pipes[lVar15][0])) {
              iVar7 = uv__close(pipes[lVar15][1]);
              if (iVar7 != 0) goto LAB_00194519;
              pipes[lVar15][1] = -1;
              uv__nonblock_ioctl(pipes[lVar15][0],1);
              uVar12 = *(uint *)((long)&puVar3->flags + lVar11);
              uVar12 = uv__stream_open(*(uv_stream_t **)((long)&puVar3->data + lVar11),
                                       pipes[lVar15][0],
                                       (uVar12 & 0x10) << 0xb | (uVar12 & 0x20) << 9);
            }
            if (uVar12 != 0) goto joined_r0x00194476;
            lVar15 = lVar15 + 1;
            lVar11 = lVar11 + 0x10;
          } while (lVar15 < options->stdio_count);
        }
        if (local_9c == 0) {
          local_98->queue[0] = local_90->process_handles;
          plVar8 = (long *)local_90->process_handles[1];
          local_98->queue[1] = plVar8;
          *plVar8 = (long)local_88;
          local_90->process_handles[1] = local_88;
          uVar12 = local_98->flags;
          if (((uVar12 & 4) == 0) && (local_98->flags = uVar12 | 4, (uVar12 & 8) != 0)) {
            puVar2 = &local_98->loop->active_handles;
            *puVar2 = *puVar2 + 1;
          }
        }
        local_98->pid = local_a4;
        local_98->exit_cb = options->exit_cb;
        uVar12 = local_9c;
        goto LAB_001942d6;
      }
      piVar10 = __errno_location();
      uVar12 = -*piVar10;
      uv_rwlock_wrunlock(rwlock);
      uv__close((int)local_b0);
      uv__close(local_b0._4_4_);
    }
  }
LAB_0019428a:
  uVar13 = local_80;
  if (pipes == (int (*) [2])0x0) {
    return uVar12;
  }
  uVar14 = 0;
  do {
    if (((long)options->stdio_count <= (long)uVar14) ||
       ((options->stdio[uVar14].flags & (UV_INHERIT_STREAM|UV_INHERIT_FD)) == UV_IGNORE)) {
      if (pipes[uVar14][0] != -1) {
        uv__close_nocheckstdio(pipes[uVar14][0]);
      }
      if (pipes[uVar14][1] != -1) {
        uv__close_nocheckstdio(pipes[uVar14][1]);
      }
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != uVar13);
LAB_001942d6:
  if (pipes != (int (*) [2])local_78) {
    uv__free(pipes);
  }
  return uVar12;
joined_r0x00194476:
  for (; lVar11 != 0; lVar11 = lVar11 + -0x10) {
    if ((*(byte *)((long)&options->stdio[-1].flags + lVar11) & 1) != 0) {
      uv__stream_close(*(uv_stream_t **)((long)options->stdio + lVar11 + -8));
    }
  }
  goto LAB_0019428a;
}

Assistant:

int uv_spawn(uv_loop_t* loop,
             uv_process_t* process,
             const uv_process_options_t* options) {
#if defined(__APPLE__) && (TARGET_OS_TV || TARGET_OS_WATCH)
  /* fork is marked __WATCHOS_PROHIBITED __TVOS_PROHIBITED. */
  return UV_ENOSYS;
#else
  int signal_pipe[2] = { -1, -1 };
  int pipes_storage[8][2];
  int (*pipes)[2];
  int stdio_count;
  ssize_t r;
  pid_t pid;
  int err;
  int exec_errorno;
  int i;
  int status;

  assert(options->file != NULL);
  assert(!(options->flags & ~(UV_PROCESS_DETACHED |
                              UV_PROCESS_SETGID |
                              UV_PROCESS_SETUID |
                              UV_PROCESS_WINDOWS_HIDE |
                              UV_PROCESS_WINDOWS_HIDE_CONSOLE |
                              UV_PROCESS_WINDOWS_HIDE_GUI |
                              UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS)));

  uv__handle_init(loop, (uv_handle_t*)process, UV_PROCESS);
  QUEUE_INIT(&process->queue);

  stdio_count = options->stdio_count;
  if (stdio_count < 3)
    stdio_count = 3;

  err = UV_ENOMEM;
  pipes = pipes_storage;
  if (stdio_count > (int) ARRAY_SIZE(pipes_storage))
    pipes = uv__malloc(stdio_count * sizeof(*pipes));

  if (pipes == NULL)
    goto error;

  for (i = 0; i < stdio_count; i++) {
    pipes[i][0] = -1;
    pipes[i][1] = -1;
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_init_stdio(options->stdio + i, pipes[i]);
    if (err)
      goto error;
  }

  /* This pipe is used by the parent to wait until
   * the child has called `execve()`. We need this
   * to avoid the following race condition:
   *
   *    if ((pid = fork()) > 0) {
   *      kill(pid, SIGTERM);
   *    }
   *    else if (pid == 0) {
   *      execve("/bin/cat", argp, envp);
   *    }
   *
   * The parent sends a signal immediately after forking.
   * Since the child may not have called `execve()` yet,
   * there is no telling what process receives the signal,
   * our fork or /bin/cat.
   *
   * To avoid ambiguity, we create a pipe with both ends
   * marked close-on-exec. Then, after the call to `fork()`,
   * the parent polls the read end until it EOFs or errors with EPIPE.
   */
  err = uv__make_pipe(signal_pipe, 0);
  if (err)
    goto error;

  uv_signal_start(&loop->child_watcher, uv__chld, SIGCHLD);

  /* Acquire write lock to prevent opening new fds in worker threads */
  uv_rwlock_wrlock(&loop->cloexec_lock);
  pid = fork();

  if (pid == -1) {
    err = UV__ERR(errno);
    uv_rwlock_wrunlock(&loop->cloexec_lock);
    uv__close(signal_pipe[0]);
    uv__close(signal_pipe[1]);
    goto error;
  }

  if (pid == 0) {
    uv__process_child_init(options, stdio_count, pipes, signal_pipe[1]);
    abort();
  }

  /* Release lock in parent process */
  uv_rwlock_wrunlock(&loop->cloexec_lock);
  uv__close(signal_pipe[1]);

  process->status = 0;
  exec_errorno = 0;
  do
    r = read(signal_pipe[0], &exec_errorno, sizeof(exec_errorno));
  while (r == -1 && errno == EINTR);

  if (r == 0)
    ; /* okay, EOF */
  else if (r == sizeof(exec_errorno)) {
    do
      err = waitpid(pid, &status, 0); /* okay, read errorno */
    while (err == -1 && errno == EINTR);
    assert(err == pid);
  } else if (r == -1 && errno == EPIPE) {
    do
      err = waitpid(pid, &status, 0); /* okay, got EPIPE */
    while (err == -1 && errno == EINTR);
    assert(err == pid);
  } else
    abort();

  uv__close_nocheckstdio(signal_pipe[0]);

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_open_stream(options->stdio + i, pipes[i]);
    if (err == 0)
      continue;

    while (i--)
      uv__process_close_stream(options->stdio + i);

    goto error;
  }

  /* Only activate this handle if exec() happened successfully */
  if (exec_errorno == 0) {
    QUEUE_INSERT_TAIL(&loop->process_handles, &process->queue);
    uv__handle_start(process);
  }

  process->pid = pid;
  process->exit_cb = options->exit_cb;

  if (pipes != pipes_storage)
    uv__free(pipes);

  return exec_errorno;

error:
  if (pipes != NULL) {
    for (i = 0; i < stdio_count; i++) {
      if (i < options->stdio_count)
        if (options->stdio[i].flags & (UV_INHERIT_FD | UV_INHERIT_STREAM))
          continue;
      if (pipes[i][0] != -1)
        uv__close_nocheckstdio(pipes[i][0]);
      if (pipes[i][1] != -1)
        uv__close_nocheckstdio(pipes[i][1]);
    }

    if (pipes != pipes_storage)
      uv__free(pipes);
  }

  return err;
#endif
}